

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O0

void symmetric_ssl_main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  epoll_event *__events;
  int64_t iVar7;
  tls_connection *ptVar8;
  request *prVar9;
  long lVar10;
  tcp_connection *conn_00;
  long *in_FS_OFFSET;
  byte_req_pair bVar11;
  long diff;
  ulong local_110;
  char local_108 [8];
  char hostname [64];
  int ssl_err;
  int ret_1;
  uint64_t wbuf_size;
  char *wbuf;
  timestamp_info *pending_tx;
  timespec latency;
  timespec rx_timestamp;
  timespec tx_timestamp;
  byte_req_pair send_res;
  byte_req_pair read_res;
  request *to_send;
  tls_connection *conn;
  epoll_event *events;
  long copied;
  long next_tx;
  int bytes_to_send;
  int ret;
  int conn_per_thread;
  int j;
  int i;
  int idx;
  int ready;
  
  uVar1 = 0x200;
  wbuf_size = (uint64_t)malloc(0x200);
  iVar2 = throughput_open_connections();
  if (iVar2 != 0) {
    return;
  }
  iVar2 = get_conn_count();
  iVar3 = get_thread_count();
  __events = (epoll_event *)malloc((long)(iVar2 / iVar3) * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  copied = time_ns();
  do {
    while (iVar4 = should_load(), iVar4 == 0) {
      copied = time_ns();
    }
    while ((iVar7 = time_ns(), copied <= iVar7 &&
           (ptVar8 = pick_conn(), ptVar8 != (tls_connection *)0x0))) {
      prVar9 = prepare_request();
      next_tx._4_4_ = 0;
      for (conn_per_thread = 0; conn_per_thread < prVar9->iov_cnt;
          conn_per_thread = conn_per_thread + 1) {
        next_tx._4_4_ = next_tx._4_4_ + (int)prVar9->iovs[conn_per_thread].iov_len;
      }
      if (uVar1 < next_tx._4_4_) {
        free((void *)wbuf_size);
        wbuf_size = (uint64_t)malloc((long)(int)next_tx._4_4_);
        uVar1 = next_tx._4_4_;
      }
      events = (epoll_event *)0x0;
      for (conn_per_thread = 0; conn_per_thread < prVar9->iov_cnt;
          conn_per_thread = conn_per_thread + 1) {
        memcpy((void *)((long)&events->events + wbuf_size),prVar9->iovs[conn_per_thread].iov_base,
               prVar9->iovs[conn_per_thread].iov_len);
        events = (epoll_event *)((long)&events->events + prVar9->iovs[conn_per_thread].iov_len);
      }
      if (events != (epoll_event *)(long)(int)next_tx._4_4_) {
        __assert_fail("copied == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x11f,"void symmetric_ssl_main(void)");
      }
      uVar6 = SSL_write((SSL *)ptVar8->ssl,(void *)wbuf_size,next_tx._4_4_);
      if (uVar6 != next_tx._4_4_) {
        __assert_fail("ret == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x123,"void symmetric_ssl_main(void)");
      }
      time_ns_to_ts((timespec *)&rx_timestamp.tv_nsec);
      push_complete_tx_timestamp
                ((pending_tx_timestamps *)
                 (*(long *)(*in_FS_OFFSET + -0x1c0) + (ulong)(ptVar8->conn).idx * 0x18),
                 (timespec *)&rx_timestamp.tv_nsec);
      (ptVar8->conn).pending_reqs = (ptVar8->conn).pending_reqs + 1;
      bVar11.reqs = 1;
      bVar11.bytes = (long)(int)uVar6;
      add_throughput_tx_sample(bVar11);
      lVar10 = get_ia();
      copied = lVar10 + copied;
    }
    iVar4 = epoll_wait(*(int *)(*in_FS_OFFSET + -0x1b8),__events,iVar2 / iVar3,0);
    for (conn_per_thread = 0; conn_per_thread < iVar4; conn_per_thread = conn_per_thread + 1) {
      conn_00 = (tcp_connection *)
                (*(long *)(*in_FS_OFFSET + -0x1b0) +
                (long)*(int *)(&__events->field_0x4 + (long)conn_per_thread * 0xc) * 0x4018);
      if (((&__events->events)[(long)conn_per_thread * 3] & 1) == 0) {
        __assert_fail("events[i].events & EPOLLIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x13a,"void symmetric_ssl_main(void)");
      }
      iVar5 = SSL_read(*(SSL **)&conn_00[1].idx,conn_00->buffer + conn_00->buffer_idx,
                       0x4000 - (uint)conn_00->buffer_idx);
      if (iVar5 < 1) {
        uVar6 = SSL_get_error(*(SSL **)&conn_00[1].idx,iVar5);
        if (uVar6 != 2) {
          if (iVar5 != 0) {
            gethostname(local_108,0x40);
            fprintf(_stderr,"[%s] ",local_108);
            fprintf(_stderr,"Unexpected SSL error %d\n",(ulong)uVar6);
            return;
          }
          SSL_shutdown(*(SSL **)&conn_00[1].idx);
          SSL_free(*(SSL **)&conn_00[1].idx);
          close(conn_00->fd);
          conn_00->closed = 1;
        }
      }
      else {
        time_ns_to_ts((timespec *)&latency.tv_nsec);
        conn_00->buffer_idx = conn_00->buffer_idx + (short)iVar5;
        bVar11 = handle_response(conn_00);
        local_110 = bVar11.reqs;
        if (local_110 != 0) {
          conn_00->pending_reqs = conn_00->pending_reqs - (short)bVar11.reqs;
          for (ret = 0; (ulong)(long)ret < local_110; ret = ret + 1) {
            wbuf = (char *)pop_pending_tx_timestamps
                                     ((pending_tx_timestamps *)
                                      (*(long *)(*in_FS_OFFSET + -0x1c0) +
                                      (ulong)conn_00->idx * 0x18));
            if ((timestamp_info *)wbuf == (timestamp_info *)0x0) {
              __assert_fail("pending_tx",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                            ,0x15e,"void symmetric_ssl_main(void)");
            }
          }
          iVar5 = timespec_diff((timespec *)&pending_tx,(timespec *)&latency.tv_nsec,
                                (timespec *)wbuf);
          if (iVar5 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                          ,0x161,"void symmetric_ssl_main(void)");
          }
          add_latency_sample((long)((double)(long)pending_tx * 1000000000.0 + (double)latency.tv_sec
                                   ),(timespec *)wbuf);
          add_throughput_rx_sample(bVar11);
        }
      }
    }
  } while( true );
}

Assistant:

static void symmetric_ssl_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx, copied;
	struct epoll_event *events;
	struct tls_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp, rx_timestamp, latency;
	struct timestamp_info *pending_tx;
	char *wbuf;
	uint64_t wbuf_size = 512;

	wbuf = malloc(wbuf_size);

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();

			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			if (bytes_to_send > wbuf_size) {
				free(wbuf);
				wbuf = malloc(bytes_to_send);
				wbuf_size = bytes_to_send;
			}

			copied = 0;
			for (i = 0; i < to_send->iov_cnt; i++) {
				memcpy(&wbuf[copied], to_send->iovs[i].iov_base,
					   to_send->iovs[i].iov_len);
				copied += to_send->iovs[i].iov_len;
			}
			assert(copied == bytes_to_send);

			int ret = SSL_write(conn->ssl, wbuf, bytes_to_send);

			assert(ret == bytes_to_send);

			time_ns_to_ts(&tx_timestamp);
			push_complete_tx_timestamp(&per_conn_tx_timestamps[conn->conn.idx],
									   &tx_timestamp);
			conn->conn.pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}

	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			assert(events[i].events & EPOLLIN);

			// read into the connection buffer
			ret = SSL_read(conn->ssl, &conn->conn.buffer[conn->conn.buffer_idx],
						   MAX_PAYLOAD - conn->conn.buffer_idx);
			if (ret <= 0) {
				int ssl_err = SSL_get_error(conn->ssl, ret);
				if (ssl_err == SSL_ERROR_WANT_READ)
					continue;

				if (ret == 0) {
					SSL_shutdown(conn->ssl);
					SSL_free(conn->ssl);
					close(conn->conn.fd);
					conn->conn.closed = 1;
					continue;
				}

				lancet_fprintf(stderr, "Unexpected SSL error %d\n", ssl_err);
				return;
			}

			time_ns_to_ts(&rx_timestamp);
			conn->conn.buffer_idx += ret;

			read_res = handle_response(&conn->conn);
			if (read_res.reqs == 0)
				continue;

			conn->conn.pending_reqs -= read_res.reqs;
			/*
			 * Assume only the last request will have an rx timestamp!
			 */
			for (j = 0; j < read_res.reqs; j++) {
				pending_tx = pop_pending_tx_timestamps(
					&per_conn_tx_timestamps[conn->conn.idx]);
				assert(pending_tx);
			}
			ret = timespec_diff(&latency, &rx_timestamp, &pending_tx->time);
			assert(ret == 0);
			long diff = latency.tv_nsec + latency.tv_sec * 1e9;
			add_latency_sample(diff, &pending_tx->time);

			/* Bookkeeping */
			add_throughput_rx_sample(read_res);
		}
	}
}